

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexPolyhedron.cpp
# Opt level: O2

void __thiscall cbtConvexPolyhedron::initialize2(cbtConvexPolyhedron *this)

{
  cbtScalar cVar1;
  cbtFace *pcVar2;
  cbtVector3 *pcVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  cbtConvexPolyhedron *this_00;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  cbtVector3 *pcVar10;
  int iVar11;
  uint uVar12;
  cbtVector3 *v2;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  cbtScalar cVar18;
  float fVar19;
  undefined8 uVar24;
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar25 [56];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar31 [56];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  cbtVector3 cVar41;
  float local_b8;
  cbtScalar TotalArea;
  ulong local_b0;
  undefined1 local_a8 [16];
  cbtVector3 *local_98;
  cbtConvexPolyhedron *local_90;
  long local_88;
  cbtVector3 *local_80;
  long local_78;
  long local_70;
  long local_68;
  cbtVector3 local_60;
  cbtVector3 local_50;
  cbtVector3 local_40;
  
  local_98 = &this->m_localCenter;
  (this->m_localCenter).m_floats[0] = 0.0;
  (this->m_localCenter).m_floats[1] = 0.0;
  (this->m_localCenter).m_floats[2] = 0.0;
  (this->m_localCenter).m_floats[3] = 0.0;
  TotalArea = 0.0;
  auVar21 = ZEXT464(0) << 0x40;
  local_b8 = 0.0;
  lVar9 = 0;
  local_90 = this;
  while (this_00 = local_90, lVar9 < (local_90->m_faces).m_size) {
    pcVar2 = (local_90->m_faces).m_data;
    local_70 = lVar9 * 0x30;
    local_78 = (long)pcVar2[lVar9].m_indices.m_size;
    local_68 = local_78 + -2;
    local_80 = (local_90->m_vertices).m_data + *pcVar2[lVar9].m_indices.m_data;
    uVar8 = 1;
    local_88 = lVar9;
    while( true ) {
      pcVar3 = local_80;
      auVar31 = in_ZMM1._8_56_;
      auVar25 = auVar21._8_56_;
      if (local_68 < (long)uVar8) break;
      local_b0 = uVar8 + 1;
      pcVar10 = (local_90->m_vertices).m_data;
      lVar9 = *(long *)((long)((local_90->m_faces).m_data)->m_plane + local_70 + -0x10);
      v2 = pcVar10 + *(int *)(lVar9 + uVar8 * 4);
      pcVar10 = pcVar10 + *(int *)(lVar9 + ((long)((ulong)(uint)((int)local_b0 >> 0x1f) << 0x20 |
                                                  local_b0 & 0xffffffff) % (long)(int)local_78 &
                                           0xffffffffU) * 4);
      cVar41 = ::operator-(local_80,v2);
      auVar26._0_8_ = cVar41.m_floats._8_8_;
      auVar26._8_56_ = auVar31;
      auVar21._0_8_ = cVar41.m_floats._0_8_;
      auVar21._8_56_ = auVar25;
      local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar21._0_16_,auVar26._0_16_);
      auVar25 = ZEXT856(local_40.m_floats._8_8_);
      cVar41 = ::operator-(pcVar3,pcVar10);
      auVar27._0_8_ = cVar41.m_floats._8_8_;
      auVar27._8_56_ = auVar31;
      auVar36._0_8_ = cVar41.m_floats._0_8_;
      auVar36._8_56_ = auVar25;
      local_50.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar36._0_16_,auVar27._0_16_);
      auVar25 = ZEXT856(local_50.m_floats._8_8_);
      cVar41 = cbtVector3::cross(&local_40,&local_50);
      auVar28._0_8_ = cVar41.m_floats._8_8_;
      auVar28._8_56_ = auVar31;
      auVar38._0_8_ = cVar41.m_floats._0_8_;
      auVar38._8_56_ = auVar25;
      local_60.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar38._0_16_,auVar28._0_16_);
      cVar18 = cbtVector3::length(&local_60);
      auVar25 = (undefined1  [56])0x0;
      local_a8 = ZEXT416((uint)(cVar18 * 0.5));
      cVar41 = ::operator+(pcVar3,v2);
      auVar29._0_8_ = cVar41.m_floats._8_8_;
      auVar29._8_56_ = auVar31;
      auVar22._0_8_ = cVar41.m_floats._0_8_;
      auVar22._8_56_ = auVar25;
      local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar22._0_16_,auVar29._0_16_);
      auVar25 = ZEXT856(local_40.m_floats._8_8_);
      cVar41 = ::operator+(&local_40,pcVar10);
      auVar30._0_8_ = cVar41.m_floats._8_8_;
      auVar30._8_56_ = auVar31;
      auVar23._0_8_ = cVar41.m_floats._0_8_;
      auVar23._8_56_ = auVar25;
      local_60.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar23._0_16_,auVar30._0_16_);
      uVar24 = local_60.m_floats._8_8_;
      local_50.m_floats[0] = 3.0;
      cVar41 = ::operator/(&local_60,local_50.m_floats);
      fVar35 = local_a8._0_4_;
      fVar16 = fVar35 * cVar41.m_floats[2];
      in_ZMM1 = ZEXT464((uint)fVar16);
      auVar20._0_4_ = fVar35 * cVar41.m_floats[0];
      auVar20._4_4_ = fVar35 * cVar41.m_floats[1];
      auVar20._8_4_ = fVar35 * (float)uVar24;
      auVar20._12_4_ = fVar35 * (float)((ulong)uVar24 >> 0x20);
      local_60.m_floats = (cbtScalar  [4])vinsertps_avx(auVar20,ZEXT416((uint)fVar16),0x28);
      cbtVector3::operator+=(local_98,&local_60);
      local_b8 = local_b8 + (float)local_a8._0_4_;
      auVar21 = ZEXT464((uint)local_b8);
      uVar8 = local_b0;
      TotalArea = local_b8;
    }
    lVar9 = local_88 + 1;
  }
  cbtVector3::operator/=(local_98,&TotalArea);
  this_00->m_radius = 3.4028235e+38;
  auVar21 = ZEXT464(0x7f7fffff);
  auVar37._8_4_ = 0x7fffffff;
  auVar37._0_8_ = 0x7fffffff7fffffff;
  auVar37._12_4_ = 0x7fffffff;
  uVar7 = (this_00->m_faces).m_size;
  cVar18 = (this_00->m_localCenter).m_floats[0];
  fVar16 = (this_00->m_localCenter).m_floats[1];
  cVar1 = (this_00->m_localCenter).m_floats[2];
  pcVar2 = (this_00->m_faces).m_data;
  for (lVar9 = 0; (ulong)(~((int)uVar7 >> 0x1f) & uVar7) * 0x30 - lVar9 != 0; lVar9 = lVar9 + 0x30)
  {
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * *(float *)((long)pcVar2->m_plane + lVar9 + 4))
                                     ),ZEXT416((uint)cVar18),
                              ZEXT416(*(uint *)((long)pcVar2->m_plane + lVar9)));
    auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)cVar1),
                              ZEXT416(*(uint *)((long)pcVar2->m_plane + lVar9 + 8)));
    auVar20 = vandps_avx(ZEXT416((uint)(auVar20._0_4_ +
                                       *(float *)((long)pcVar2->m_plane + lVar9 + 0xc))),auVar37);
    if (auVar20._0_4_ < auVar21._0_4_) {
      auVar21 = ZEXT1664(auVar20);
      this_00->m_radius = auVar20._0_4_;
    }
  }
  uVar7 = (this_00->m_vertices).m_size;
  auVar15 = ZEXT816(0x7f7fffffff7fffff);
  auVar14 = ZEXT816(0xff7fffff7f7fffff);
  auVar36 = ZEXT464(0x7f7fffff);
  auVar38 = ZEXT464(0xff7fffff);
  pcVar3 = (this_00->m_vertices).m_data;
  lVar9 = 0;
  while( true ) {
    fVar16 = auVar15._4_4_;
    fVar35 = auVar15._8_4_;
    fVar17 = auVar15._12_4_;
    fVar32 = auVar14._4_4_;
    fVar33 = auVar14._8_4_;
    fVar34 = auVar14._12_4_;
    if ((ulong)(~((int)uVar7 >> 0x1f) & uVar7) << 4 == lVar9) break;
    uVar8 = *(ulong *)((long)pcVar3->m_floats + lVar9);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar8;
    auVar20 = vblendps_avx(auVar39,auVar14,2);
    auVar37 = vinsertps_avx(auVar14,auVar39,0x50);
    auVar40 = vinsertps_avx(auVar15,auVar39,0x50);
    uVar4 = vcmpps_avx512vl(auVar20,auVar37,1);
    auVar20 = vblendps_avx(auVar39,auVar15,2);
    uVar5 = vcmpps_avx512vl(auVar40,auVar20,1);
    lVar6 = lVar9 + 8;
    lVar9 = lVar9 + 0x10;
    bVar13 = (bool)((byte)uVar4 & 1);
    iVar11 = (int)(uVar8 >> 0x20);
    auVar14._0_4_ = (uint)bVar13 * (int)uVar8 | (uint)!bVar13 * (int)auVar14._0_4_;
    bVar13 = (bool)((byte)(uVar4 >> 1) & 1);
    auVar14._4_4_ = (uint)bVar13 * iVar11 | (uint)!bVar13 * (int)fVar32;
    auVar14._8_4_ = (uint)!(bool)((byte)(uVar4 >> 2) & 1) * (int)fVar33;
    auVar14._12_4_ = (uint)!(bool)((byte)(uVar4 >> 3) & 1) * (int)fVar34;
    bVar13 = (bool)((byte)uVar5 & 1);
    auVar15._0_4_ = (uint)bVar13 * (int)uVar8 | (uint)!bVar13 * (int)auVar15._0_4_;
    bVar13 = (bool)((byte)(uVar5 >> 1) & 1);
    auVar15._4_4_ = (uint)bVar13 * iVar11 | (uint)!bVar13 * (int)fVar16;
    auVar15._8_4_ = (uint)!(bool)((byte)(uVar5 >> 2) & 1) * (int)fVar35;
    auVar15._12_4_ = (uint)!(bool)((byte)(uVar5 >> 3) & 1) * (int)fVar17;
    auVar37 = ZEXT416(*(uint *)((long)pcVar3->m_floats + lVar6));
    auVar20 = vminss_avx(auVar37,auVar36._0_16_);
    auVar36 = ZEXT1664(auVar20);
    auVar20 = vmaxss_avx(auVar37,auVar38._0_16_);
    auVar38 = ZEXT1664(auVar20);
  }
  fVar19 = auVar21._0_4_ / 1.7320508;
  auVar40._0_4_ = auVar14._0_4_ + auVar15._0_4_;
  auVar40._4_4_ = fVar32 + fVar16;
  auVar40._8_4_ = fVar33 + fVar35;
  auVar40._12_4_ = fVar34 + fVar17;
  auVar20 = vblendps_avx(auVar15,auVar14,2);
  auVar37 = vblendps_avx(auVar14,auVar15,2);
  auVar20 = vsubps_avx(auVar20,auVar37);
  uVar24 = vmovlps_avx(auVar40);
  *(undefined8 *)(this_00->mC).m_floats = uVar24;
  (this_00->mC).m_floats[2] = auVar38._0_4_ + auVar36._0_4_;
  (this_00->mC).m_floats[3] = 0.0;
  uVar24 = vmovlps_avx(auVar20);
  *(undefined8 *)(this_00->mE).m_floats = uVar24;
  (this_00->mE).m_floats[2] = auVar38._0_4_ - auVar36._0_4_;
  (this_00->mE).m_floats[3] = 0.0;
  uVar7 = cbtVector3::maxAxis(&this_00->mE);
  iVar11 = 0x400;
  cVar18 = (this_00->mE).m_floats[(int)uVar7];
  (this_00->m_extents).m_floats[2] = fVar19;
  (this_00->m_extents).m_floats[1] = fVar19;
  (this_00->m_extents).m_floats[0] = fVar19;
  auVar20 = vfmsub132ss_fma(ZEXT416((uint)cVar18),ZEXT416((uint)fVar19),
                            SUB6416(ZEXT464(0x3f000000),0));
  (this_00->m_extents).m_floats[(int)uVar7] = (this_00->mE).m_floats[(int)uVar7] * 0.5;
  local_a8._0_4_ = auVar20._0_4_ * 0.0009765625;
  while( true ) {
    bVar13 = iVar11 == 0;
    iVar11 = iVar11 + -1;
    if (bVar13) {
      (this_00->m_extents).m_floats[2] = fVar19;
      (this_00->m_extents).m_floats[1] = fVar19;
      (this_00->m_extents).m_floats[0] = fVar19;
      return;
    }
    bVar13 = testContainment(this_00);
    if (bVar13) break;
    (this_00->m_extents).m_floats[(int)uVar7] =
         (this_00->m_extents).m_floats[(int)uVar7] - (float)local_a8._0_4_;
  }
  local_a8._0_4_ = (this_00->m_radius - fVar19) * 0.0009765625;
  iVar11 = 0x401;
  uVar7 = 1 << (uVar7 & 0x1f) & 3;
  uVar12 = 1 << uVar7 & 3;
  do {
    iVar11 = iVar11 + -1;
    if (iVar11 == 0) {
      return;
    }
    fVar16 = (this_00->m_extents).m_floats[uVar7];
    local_b0 = CONCAT44(local_b0._4_4_,(this_00->m_extents).m_floats[uVar12]);
    (this_00->m_extents).m_floats[uVar7] = (float)local_a8._0_4_ + fVar16;
    (this_00->m_extents).m_floats[uVar12] =
         (float)local_a8._0_4_ + (this_00->m_extents).m_floats[uVar12];
    bVar13 = testContainment(this_00);
  } while (bVar13);
  (this_00->m_extents).m_floats[uVar7] = fVar16;
  (this_00->m_extents).m_floats[uVar12] = (cbtScalar)local_b0;
  return;
}

Assistant:

void cbtConvexPolyhedron::initialize2()
{
	m_localCenter.setValue(0, 0, 0);
	cbtScalar TotalArea = 0.0f;
	for (int i = 0; i < m_faces.size(); i++)
	{
		int numVertices = m_faces[i].m_indices.size();
		int NbTris = numVertices - 2;

		const cbtVector3& p0 = m_vertices[m_faces[i].m_indices[0]];
		for (int j = 1; j <= NbTris; j++)
		{
			int k = (j + 1) % numVertices;
			const cbtVector3& p1 = m_vertices[m_faces[i].m_indices[j]];
			const cbtVector3& p2 = m_vertices[m_faces[i].m_indices[k]];
			cbtScalar Area = ((p0 - p1).cross(p0 - p2)).length() * 0.5f;
			cbtVector3 Center = (p0 + p1 + p2) / 3.0f;
			m_localCenter += Area * Center;
			TotalArea += Area;
		}
	}
	m_localCenter /= TotalArea;

#ifdef TEST_INTERNAL_OBJECTS
	if (1)
	{
		m_radius = FLT_MAX;
		for (int i = 0; i < m_faces.size(); i++)
		{
			const cbtVector3 Normal(m_faces[i].m_plane[0], m_faces[i].m_plane[1], m_faces[i].m_plane[2]);
			const cbtScalar dist = cbtFabs(m_localCenter.dot(Normal) + m_faces[i].m_plane[3]);
			if (dist < m_radius)
				m_radius = dist;
		}

		cbtScalar MinX = FLT_MAX;
		cbtScalar MinY = FLT_MAX;
		cbtScalar MinZ = FLT_MAX;
		cbtScalar MaxX = -FLT_MAX;
		cbtScalar MaxY = -FLT_MAX;
		cbtScalar MaxZ = -FLT_MAX;
		for (int i = 0; i < m_vertices.size(); i++)
		{
			const cbtVector3& pt = m_vertices[i];
			if (pt.x() < MinX) MinX = pt.x();
			if (pt.x() > MaxX) MaxX = pt.x();
			if (pt.y() < MinY) MinY = pt.y();
			if (pt.y() > MaxY) MaxY = pt.y();
			if (pt.z() < MinZ) MinZ = pt.z();
			if (pt.z() > MaxZ) MaxZ = pt.z();
		}
		mC.setValue(MaxX + MinX, MaxY + MinY, MaxZ + MinZ);
		mE.setValue(MaxX - MinX, MaxY - MinY, MaxZ - MinZ);

		//		const cbtScalar r = m_radius / sqrtf(2.0f);
		const cbtScalar r = m_radius / sqrtf(3.0f);
		const int LargestExtent = mE.maxAxis();
		const cbtScalar Step = (mE[LargestExtent] * 0.5f - r) / 1024.0f;
		m_extents[0] = m_extents[1] = m_extents[2] = r;
		m_extents[LargestExtent] = mE[LargestExtent] * 0.5f;
		bool FoundBox = false;
		for (int j = 0; j < 1024; j++)
		{
			if (testContainment())
			{
				FoundBox = true;
				break;
			}

			m_extents[LargestExtent] -= Step;
		}
		if (!FoundBox)
		{
			m_extents[0] = m_extents[1] = m_extents[2] = r;
		}
		else
		{
			// Refine the box
			const cbtScalar Step = (m_radius - r) / 1024.0f;
			const int e0 = (1 << LargestExtent) & 3;
			const int e1 = (1 << e0) & 3;

			for (int j = 0; j < 1024; j++)
			{
				const cbtScalar Saved0 = m_extents[e0];
				const cbtScalar Saved1 = m_extents[e1];
				m_extents[e0] += Step;
				m_extents[e1] += Step;

				if (!testContainment())
				{
					m_extents[e0] = Saved0;
					m_extents[e1] = Saved1;
					break;
				}
			}
		}
	}
#endif
}